

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

AllocatedData * __thiscall
duckdb::AllocatedData::operator=(AllocatedData *this,AllocatedData *other)

{
  Allocator *pAVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  
  pAVar1 = (this->allocator).ptr;
  (this->allocator).ptr = (other->allocator).ptr;
  (other->allocator).ptr = pAVar1;
  pdVar2 = this->pointer;
  this->pointer = other->pointer;
  other->pointer = pdVar2;
  iVar3 = this->allocated_size;
  this->allocated_size = other->allocated_size;
  other->allocated_size = iVar3;
  return this;
}

Assistant:

AllocatedData &AllocatedData::operator=(AllocatedData &&other) noexcept {
	std::swap(allocator, other.allocator);
	std::swap(pointer, other.pointer);
	std::swap(allocated_size, other.allocated_size);
	return *this;
}